

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O3

double __thiscall DynamicHistogram<double>::order(DynamicHistogram<double> *this,int kth)

{
  double dVar1;
  int iVar2;
  runtime_error *this_00;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  vector<double,_std::allocator<double>_> dist;
  double local_58;
  vector<double,_std::allocator<double>_> local_48;
  double local_30;
  double local_28;
  
  iVar2 = (*this->_vptr_DynamicHistogram[2])();
  if ((char)iVar2 == '\0') {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"DynamicHistogram::order - Histogram could not be initialized.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_58 = bin(this,0);
  dVar6 = total(this);
  cdf(&local_48,this);
  lVar3 = (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  if ((int)lVar3 < 2) {
LAB_0018cf85:
    if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start == (pointer)0x0) {
      return local_58;
    }
  }
  else {
    dVar6 = (double)kth / dVar6;
    if (dVar6 <= 0.0) {
      dVar6 = 0.0;
    }
    if (1.0 <= dVar6) {
      dVar6 = 1.0;
    }
    uVar4 = 0;
    do {
      if ((lVar3 + (ulong)(lVar3 == 0)) - 1 == uVar4) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      dVar7 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar4 + 1];
      if ((((dVar7 != 0.0) || (NAN(dVar7))) && (dVar6 <= dVar7)) &&
         (dVar1 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar4], dVar1 <= dVar6)) {
        uVar5 = uVar4 + 1;
        iVar2 = (int)uVar4;
        if ((dVar7 == dVar1) && (!NAN(dVar7) && !NAN(dVar1))) {
          local_58 = bin(this,iVar2);
          dVar6 = bin(this,(int)uVar5);
          dVar7 = bin(this,iVar2);
          local_58 = (dVar6 - dVar7) * 0.5 + local_58;
          goto LAB_0018cf85;
        }
        dVar7 = bin(this,(int)uVar5);
        local_28 = bin(this,iVar2);
        if (uVar5 < (ulong)((long)local_48.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_48.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 3)) {
          local_30 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar4 + 1] -
                     local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar4];
          local_58 = bin(this,iVar2);
          uVar5 = uVar4;
          if (uVar4 < (ulong)((long)local_48.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_48.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 3)) {
            local_58 = (dVar6 - local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start[uVar4]) *
                       ((dVar7 - local_28) / local_30) + local_58;
            break;
          }
        }
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar5
                  );
      }
      uVar4 = uVar4 + 1;
    } while ((int)lVar3 - 1 != uVar4);
  }
  operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage -
                  (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
  return local_58;
}

Assistant:

double
    order(int kth)
    {
        if (!this->merge()) throw std::runtime_error("DynamicHistogram::order - Histogram could not be initialized.");

        // Estimate of the k'th order statistic
        double estimate = this->bin(0);

        // Compute order's probability and clip at [0,1]
        double numItems = this->total();
        double probability = (double) (kth) / numItems;
        probability = std::max<double>(0, probability);
        probability = std::min<double>(1, probability);

        // Look up probability in cdf
        std::vector<double> dist = this->cdf();
        int numBins = dist.size();
        for (int i = 0; i < numBins-1; i++)
        {
            if (dist.at(i+1) == 0) continue;
            if ((dist.at(i) <= probability) && (probability <= dist.at(i+1)))
            {
                if (dist.at(i+1) == dist.at(i))
                {
                    // If flat cdf avoid divide-by-zero
                    estimate = this->bin(i) + 0.5 * (this->bin(i+1) - this->bin(i));
                }
                else
                {
                    // Linearly interpolate between enclosing bins
                    double slope = (this->bin(i+1) - this->bin(i)) / (dist.at(i+1) - dist.at(i));
                    estimate = this->bin(i) + slope * (probability - dist.at(i));
                }
                return estimate;
            }
        }

        return estimate;

    }